

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O1

void __thiscall CDevice::Poke(CDevice *this,aint z80adr,byte value)

{
  int iVar1;
  CDevicePage *pCVar2;
  
  iVar1 = GetPageOfA16(this,z80adr);
  if (iVar1 != -1) {
    pCVar2 = this->Pages[iVar1];
    if (pCVar2 == (CDevicePage *)0x0) {
      Error("Wrong page number",lp,PASS3);
      pCVar2 = this->Pages[0];
    }
    pCVar2->RAM[(long)z80adr & (long)pCVar2->Size - 1U] = value;
  }
  return;
}

Assistant:

void CDevice::Poke(aint z80adr, byte value) {
	// write byte into device memory with current page-mapping
	const int adrPage = GetPageOfA16(z80adr);
	if (-1 == adrPage) return;		// silently ignore invalid address
	CDevicePage* page = GetPage(adrPage);
	page->RAM[z80adr & (page->Size-1)] = value;
}